

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.cpp
# Opt level: O1

int __thiscall argo::pointer::from_hex(pointer *this,string *s,size_t index)

{
  char cVar1;
  int iVar2;
  json_pointer_exception *this_00;
  
  cVar1 = (s->_M_dataplus)._M_p[index];
  iVar2 = -0x30;
  if (9 < (byte)(cVar1 - 0x30U)) {
    iVar2 = -0x37;
    if (5 < (byte)(cVar1 + 0xbfU)) {
      this_00 = (json_pointer_exception *)__cxa_allocate_exception(0xd8);
      json_pointer_exception::json_pointer_exception
                (this_00,syntax_error_in_pointer_string_e,(int)index + -1);
      __cxa_throw(this_00,&json_pointer_exception::typeinfo,std::exception::~exception);
    }
  }
  return iVar2 + cVar1;
}

Assistant:

int pointer::from_hex(const string &s, size_t index)
{
    char c = s[index];

    if (c >= '0' && c <= '9')
    {
        return c - '0';
    }
    else if (c >= 'A' && c <= 'F')
    {
        return c - 'A' + 10;
    }
    else
    {
        throw json_pointer_exception(json_exception::syntax_error_in_pointer_string_e, index - 1);
    }
}